

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  bool bVar5;
  string fileName;
  string se;
  cmGeneratedFileStream exportFileStream;
  ostringstream e;
  long *local_448;
  long local_440;
  long local_438 [2];
  long *local_428;
  long local_420;
  long local_418 [2];
  long *local_408;
  long local_3f8 [2];
  undefined1 local_3e8 [32];
  byte abStack_3c8 [552];
  undefined1 local_1a0 [376];
  
  bVar2 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  bVar5 = true;
  if (bVar2) {
    pcVar1 = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_448 = local_438;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_448,pcVar1,
               pcVar1 + (this->super_cmExportFileGenerator).FileDir._M_string_length);
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::string::_M_append
              ((char *)&local_448,
               (ulong)(this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_448);
    if (config->_M_string_length == 0) {
      std::__cxx11::string::append((char *)&local_448);
    }
    else {
      cmsys::SystemTools::LowerCase((string *)local_3e8,config);
      std::__cxx11::string::_M_append((char *)&local_448,local_3e8._0_8_);
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
    }
    std::__cxx11::string::_M_append
              ((char *)&local_448,
               (ulong)(this->super_cmExportFileGenerator).FileExt._M_dataplus._M_p);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_3e8,(char *)local_448,true);
    bVar5 = (abStack_3c8[*(long *)(local_3e8._0_8_ + -0x18)] & 5) == 0;
    if (bVar5) {
      cmExportFileGenerator::GenerateImportHeaderCode
                (&this->super_cmExportFileGenerator,(ostream *)local_3e8,config);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,(ostream *)local_3e8,config,missingTargets);
      cmExportFileGenerator::GenerateImportFooterCode
                (&this->super_cmExportFileGenerator,(ostream *)local_3e8);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigImportFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar4);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"cannot write to file \"",0x16);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(char *)local_448,local_440);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_428,local_420);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((char *)local_408,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_408 != local_3f8) {
        operator_delete(local_408,local_3f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      if (local_428 != local_418) {
        operator_delete(local_428,local_418[0] + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3e8);
    if (local_448 != local_438) {
      operator_delete(local_448,local_438[0] + 1);
    }
  }
  return bVar5;
}

Assistant:

bool
cmExportInstallFileGenerator::GenerateImportFileConfig(
                                    const std::string& config,
                                    std::vector<std::string> &missingTargets)
{
  // Skip configurations not enabled for this export.
  if(!this->IEGen->InstallsForConfig(config))
    {
    return true;
    }

  // Construct the name of the file to generate.
  std::string fileName = this->FileDir;
  fileName += "/";
  fileName += this->FileBase;
  fileName += "-";
  if(!config.empty())
    {
    fileName += cmSystemTools::LowerCase(config);
    }
  else
    {
    fileName += "noconfig";
    }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName.c_str(), true);
  if(!exportFileStream)
    {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName
      << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config, missingTargets);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}